

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte *pbVar1;
  MMFWEntryName *pacVar2;
  ushort uVar3;
  uint32_t uVar4;
  MMFW *mmfw_00;
  char *pcVar5;
  int *piVar6;
  MMFWEntry *pMVar7;
  FILE *__s;
  uint8_t *__ptr;
  uint16_t local_74;
  ushort local_70;
  FILE *outf;
  MMFWEntry *entry_1;
  uint8_t *unknown;
  MMFWEntry *entry;
  uint16_t i;
  uint16_t max_i;
  uint16_t min_i;
  MMFW *mmfw;
  char *pcStack_28;
  LPStatus status;
  char *path;
  char **ppcStack_18;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  progname = *argv;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  do {
    path._4_4_ = LPGetopt((int)argv_local,ppcStack_18,"ahn:tvx");
    if (path._4_4_ == -1) {
      argv_local._0_4_ = (int)argv_local - _optind;
      ppcStack_18 = ppcStack_18 + _optind;
      if (mode == MMFW_TOOL_MODE_NONE) {
        usage();
        argv_local._4_4_ = 1;
      }
      else if ((int)argv_local < 1) {
        usage();
        argv_local._4_4_ = 1;
      }
      else if (((mode == MMFW_TOOL_MODE_EXTRACT) && ((want_extract_all & 1U) != 0)) &&
              (-1 < which_member)) {
        usage();
        argv_local._4_4_ = 1;
      }
      else if (((mode == MMFW_TOOL_MODE_EXTRACT) && ((want_extract_all & 1U) == 0)) &&
              (which_member < 0)) {
        usage();
        argv_local._4_4_ = 1;
      }
      else {
        pcStack_28 = *ppcStack_18;
        mmfw_00 = MMFW_NewFromFile(pcStack_28,(LPStatus *)((long)&mmfw + 4));
        if (mmfw._4_4_ == LUNAPURPURA_OK) {
          pcVar5 = MMFW_KindString(mmfw_00);
          LPLog("mmfw","\"%s\" MMFW archive with %d members",pcVar5,(ulong)mmfw_00->n_entries);
          entry._6_2_ = 0;
          entry._4_2_ = 0;
          if (mode == MMFW_TOOL_MODE_LIST) {
            entry._6_2_ = 0;
            entry._4_2_ = mmfw_00->n_entries;
          }
          else if (mode == MMFW_TOOL_MODE_EXTRACT) {
            local_70 = (ushort)which_member;
            uVar3 = local_70;
            if ((want_extract_all & 1U) != 0) {
              local_70 = 0;
            }
            entry._6_2_ = local_70;
            if ((want_extract_all & 1U) == 0) {
              local_74 = uVar3 + 1;
            }
            else {
              local_74 = mmfw_00->n_entries;
            }
            entry._4_2_ = local_74;
          }
          for (entry._2_2_ = entry._6_2_; entry._2_2_ < entry._4_2_; entry._2_2_ = entry._2_2_ + 1)
          {
            if (mode == MMFW_TOOL_MODE_LIST) {
              pMVar7 = MMFW_EntryAtIndex(mmfw_00,(uint)entry._2_2_);
              if (pMVar7->kind == MMFW_KIND_SOUNDS) {
                pbVar1 = ((pMVar7->entry).sound)->unknown;
                pacVar2 = mmfw_00->names;
                pcVar5 = MMFWSoundEntryFormat_String(((pMVar7->entry).sound)->fmt);
                printf("%d\t%-32s\t%s\t(%d,%d,%d,%d)\t%u\n",(ulong)entry._2_2_,pacVar2 + entry._2_2_
                       ,pcVar5,(ulong)*pbVar1,(ulong)pbVar1[1],(uint)pbVar1[2],(uint)pbVar1[3],
                       mmfw_00->offsets[entry._2_2_]);
              }
              else {
                printf("%d\t%-32s\t%u\n",(ulong)entry._2_2_,mmfw_00->names + entry._2_2_,
                       (ulong)mmfw_00->offsets[entry._2_2_]);
              }
            }
            else if (mode == MMFW_TOOL_MODE_EXTRACT) {
              pMVar7 = MMFW_EntryAtIndex(mmfw_00,(uint)entry._2_2_);
              __s = fopen(mmfw_00->names[entry._2_2_],"wb");
              __ptr = MMFW_EntryData(pMVar7);
              uVar4 = MMFW_EntryLength(pMVar7);
              fwrite(__ptr,1,(ulong)uVar4,__s);
              fclose(__s);
              MMFW_FreeEntry(pMVar7);
              if ((verbose & 1U) != 0) {
                fprintf(_stderr,"x\t%s\n",mmfw_00->names + entry._2_2_);
              }
            }
          }
          MMFW_Close(mmfw_00);
          argv_local._4_4_ = 0;
        }
        else {
          pcVar5 = LPStatusString(mmfw._4_4_);
          LPWarn("mmfw","couldn\'t read mmfw: %s",pcVar5);
          if (mmfw._4_4_ == LUNAPURPURA_CANTOPENFILE) {
            piVar6 = __errno_location();
            pcVar5 = strerror(*piVar6);
            LPWarn("mmfw","%s",pcVar5);
          }
          MMFW_Close(mmfw_00);
          argv_local._4_4_ = 1;
        }
      }
      return argv_local._4_4_;
    }
    switch(path._4_4_) {
    case 0x3f:
    default:
      usage();
      return 1;
    case 0x61:
      want_extract_all = true;
      break;
    case 0x68:
      usage();
      return 0;
    case 0x6e:
      which_member = atoi(_optarg);
      break;
    case 0x74:
      mode = MMFW_TOOL_MODE_LIST;
      break;
    case 0x76:
      verbose = true;
      break;
    case 0x78:
      mode = MMFW_TOOL_MODE_EXTRACT;
    }
  } while( true );
}

Assistant:

int
main(int argc, char *argv[])
{
#ifdef LUNAPURPURA_HAVE_GETPROGNAME
	progname = (char *)getprogname();
#else
	progname = argv[0];
#endif

	int ch;

	while ((ch = LPGetopt(argc, argv, "ahn:tvx")) != -1) {
		switch (ch) {
		case 'a':
			want_extract_all = true;
			break;
		case 'h':
			usage();
			return EXIT_SUCCESS;
			break;
		case 'n':
			which_member = atoi(optarg);
			break;
		case 't':
			mode = MMFW_TOOL_MODE_LIST;
			break;
		case 'x':
			mode = MMFW_TOOL_MODE_EXTRACT;
			break;
		case 'v':
			verbose = true;
			break;
		case '?': /* FALLTHROUGH */
		default:
			usage();
			return EXIT_FAILURE;
		}
	}
	argc -= optind;
	argv += optind;

	if (mode == MMFW_TOOL_MODE_NONE) {
		usage();
		return EXIT_FAILURE;
	}

	if (argc < 1) {
		usage();
		return EXIT_FAILURE;
	}

	if ((mode == MMFW_TOOL_MODE_EXTRACT) && want_extract_all && which_member >= 0) {
		usage();
		return EXIT_FAILURE;
	}

	if ((mode == MMFW_TOOL_MODE_EXTRACT) && !want_extract_all && (which_member < 0)) {
		usage();
		return EXIT_FAILURE;
	}

	const char *path = argv[0];
	LPStatus status;
	MMFW *mmfw = MMFW_NewFromFile(path, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(LP_SUBSYSTEM_MMFW, "couldn't read mmfw: %s", LPStatusString(status));
		if (status == LUNAPURPURA_CANTOPENFILE) {
			LPWarn(LP_SUBSYSTEM_MMFW, "%s", strerror(errno));
		}
		goto fail;
	}

	LPLog(
		LP_SUBSYSTEM_MMFW, "\"%s\" MMFW archive with %d members",
		MMFW_KindString(mmfw), mmfw->n_entries
	);

	uint16_t min_i = 0;
	uint16_t max_i = 0;

	switch (mode) {
	case MMFW_TOOL_MODE_LIST:
		min_i = 0;
		max_i = mmfw->n_entries;
		break;
	case MMFW_TOOL_MODE_EXTRACT:
		min_i = want_extract_all ? 0 : which_member;
		max_i = want_extract_all ? mmfw->n_entries : which_member+1;
		break;
	default:
		; /* NOTREACHED */
	}

	for (uint16_t i = min_i; i < max_i; i++) {
		switch (mode) {
		case MMFW_TOOL_MODE_LIST:
			{
				MMFWEntry *entry = MMFW_EntryAtIndex(mmfw, i);
				switch (entry->kind) {
				case MMFW_KIND_SOUNDS:
					{
						uint8_t *unknown = entry->entry.sound->unknown;
						printf(
							"%d\t%-32s\t%s\t(%d,%d,%d,%d)\t%u\n",
							i,
							mmfw->names[i],
							MMFWSoundEntryFormat_String(entry->entry.sound->fmt),
							unknown[0], unknown[1], unknown[2], unknown[3],
							mmfw->offsets[i]
						);
					}
					break;
				default:
					printf("%d\t%-32s\t%u\n", i, mmfw->names[i], mmfw->offsets[i]);
				}
			}
			break;
		case MMFW_TOOL_MODE_EXTRACT:
			{
				MMFWEntry *entry = MMFW_EntryAtIndex(mmfw, i);
				FILE *outf = fopen(mmfw->names[i], "wb");
				fwrite(MMFW_EntryData(entry), 1, MMFW_EntryLength(entry), outf);
				fclose(outf);
				MMFW_FreeEntry(entry);
				if (verbose) {
					fprintf(stderr, "x\t%s\n", mmfw->names[i]);
				}
			}
			break;
		default:
			; /* NOTREACHED */
		}
	}

	MMFW_Close(mmfw);
	return EXIT_SUCCESS;

fail:
	MMFW_Close(mmfw);
	return EXIT_FAILURE;
}